

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O1

void * choice_new(t_float fnonrepeat)

{
  t_object *owner;
  t_symbol *s;
  t_pd p_Var1;
  
  owner = (t_object *)pd_new(choice_class);
  s = gensym("float");
  outlet_new(owner,s);
  p_Var1 = (t_pd)getbytes(0);
  owner[1].te_g.g_pd = p_Var1;
  *(undefined4 *)&owner[1].te_g.g_next = 0;
  *(uint *)((long)&owner[1].te_g.g_next + 4) = -(uint)(fnonrepeat != 0.0) & 1;
  return owner;
}

Assistant:

static void *choice_new(t_float fnonrepeat)
{
    t_choice *x = (t_choice *)pd_new(choice_class);
    outlet_new(&x->x_obj, gensym("float"));
    x->x_vec = (t_elem *)getbytes(0);
    x->x_n = 0;
    x->x_nonrepeat = (fnonrepeat != 0);
    return (x);
}